

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_pack1to4_int8.h
# Opt level: O0

void ncnn::convolution_pack1to4_int8_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_int8,int kernel_w,int kernel_h,
               int dilation_w,int dilation_h,int stride_w,int stride_h,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int in_ECX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  __m128i _s0;
  __m128i _sh;
  __m128i _sl;
  __m128i _w;
  __m128i _val;
  int k;
  char *sptr;
  Mat m_2;
  int q;
  char *kptr;
  __m128i _sum0;
  int j_1;
  int i_1;
  int *outptr;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int channels;
  int w;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  allocator_type *in_stack_fffffffffffffa20;
  size_type in_stack_fffffffffffffa28;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa30;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  int local_504;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined4 local_4e0;
  long local_4d8;
  undefined4 local_4d0;
  undefined4 local_4cc;
  undefined4 local_4c8;
  undefined4 local_4c4;
  undefined4 local_4c0;
  undefined8 local_4b8;
  int local_4ac;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined4 local_490;
  long local_488;
  undefined4 local_480;
  undefined4 local_47c;
  undefined4 local_478;
  undefined4 local_474;
  undefined4 local_470;
  undefined8 local_468;
  ulong *local_460;
  undefined1 local_458 [16];
  int local_448;
  int local_444;
  undefined8 local_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined4 local_428;
  long local_420;
  undefined4 local_418;
  undefined4 local_414;
  undefined4 local_410;
  undefined4 local_40c;
  undefined4 local_408;
  undefined8 local_400;
  long local_3f8;
  int local_3f0;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  int local_3e0;
  int local_3dc;
  reference local_3d8;
  vector<int,_std::allocator<int>_> local_3b8;
  int local_39c;
  int local_398;
  int local_394;
  int local_390;
  int local_38c;
  int local_388;
  int local_384;
  int local_380;
  int local_37c;
  long *local_378;
  long *local_370;
  long *local_368;
  undefined8 *local_360;
  undefined8 *local_358;
  undefined8 *local_350;
  undefined8 *local_328;
  undefined8 *local_318;
  undefined8 *local_308;
  undefined1 local_2fd;
  int local_2fc;
  undefined8 *local_2f0;
  undefined1 local_2cd;
  int local_2cc;
  undefined8 *local_2c0;
  undefined1 local_29d;
  int local_29c;
  undefined8 *local_290;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  long local_218;
  undefined4 local_20c;
  long local_208;
  ulong *local_200;
  undefined4 local_1f4;
  int local_1f0;
  int local_1ec;
  undefined8 *local_1e8;
  long local_1e0;
  undefined4 local_1d4;
  long local_1d0;
  long local_1c8;
  undefined4 local_1bc;
  int local_1b8;
  int local_1b4;
  undefined8 *local_1b0;
  long local_1a8;
  undefined4 local_19c;
  long local_198;
  long local_190;
  undefined4 local_184;
  int local_180;
  int local_17c;
  undefined8 *local_178;
  undefined4 local_16c;
  long local_168;
  undefined4 local_15c;
  long local_158;
  undefined4 local_14c;
  long local_148;
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 uStack_100;
  ulong local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  ulong uStack_e0;
  undefined1 local_d8 [16];
  ulong local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  allocator_type *paStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  allocator_type *paStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  undefined8 uStack_50;
  ulong *local_48;
  int local_3c;
  undefined8 *local_38;
  ushort local_2a;
  undefined1 local_28 [24];
  ushort local_10;
  ushort local_e;
  ushort local_c;
  ushort local_a;
  ushort local_8;
  ushort local_6;
  ushort local_4;
  ushort local_2;
  
  local_388 = *(int *)((long)in_RDI + 0x2c);
  local_38c = (int)in_RDI[7];
  local_390 = *(int *)((long)in_RSI + 0x2c);
  local_394 = (int)in_RSI[6];
  local_398 = (int)in_RSI[7];
  local_39c = in_ECX * in_R8D;
  local_384 = in_R9D;
  local_380 = in_R8D;
  local_37c = in_ECX;
  local_378 = in_RDX;
  local_370 = in_RSI;
  local_368 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x88761a);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  std::allocator<int>::~allocator((allocator<int> *)0x887646);
  local_3d8 = std::vector<int,_std::allocator<int>_>::operator[](&local_3b8,0);
  local_3dc = 0;
  local_3e0 = 0;
  local_3e4 = local_388 * in_stack_00000008 - local_37c * local_384;
  for (local_3e8 = 0; local_3e8 < local_380; local_3e8 = local_3e8 + 1) {
    for (local_3ec = 0; local_3ec < local_37c; local_3ec = local_3ec + 1) {
      local_3d8[local_3dc] = local_3e0;
      local_3dc = local_3dc + 1;
      local_3e0 = local_384 + local_3e0;
    }
    local_3e0 = local_3e4 + local_3e0;
  }
  for (local_3f0 = 0; local_3f0 < local_398; local_3f0 = local_3f0 + 1) {
    local_2f0 = &local_440;
    local_17c = *(int *)((long)local_370 + 0x2c);
    local_180 = (int)local_370[6];
    local_184 = *(undefined4 *)((long)local_370 + 0x34);
    local_190 = *local_370 + local_370[8] * (long)local_3f0 * local_370[2];
    local_198 = local_370[2];
    local_19c = (undefined4)local_370[3];
    local_1a8 = local_370[4];
    local_178 = &local_440;
    local_168 = (long)local_17c * (long)local_180 * local_198;
    local_120 = &local_440;
    local_360 = &local_440;
    local_16c = 0x10;
    local_2fc = local_3f0;
    local_2fd = 1;
    local_440 = 0;
    local_430 = 0;
    local_428 = 0;
    local_418 = 0;
    local_414 = 0;
    local_410 = 0;
    local_40c = 0;
    local_408 = 0;
    local_400 = 0;
    local_438 = 0;
    local_3f8 = local_190;
    for (local_444 = 0; local_444 < local_394; local_444 = local_444 + 1) {
      for (local_448 = 0; local_448 < local_390; local_448 = local_448 + 1) {
        local_458 = ZEXT816(0);
        local_290 = &local_4a8;
        local_1ec = *(int *)((long)local_378 + 0x2c);
        local_1f0 = (int)local_378[6];
        local_1f4 = *(undefined4 *)((long)local_378 + 0x34);
        local_200 = (ulong *)(*local_378 + local_378[8] * (long)local_3f0 * local_378[2]);
        local_208 = local_378[2];
        local_20c = (undefined4)local_378[3];
        local_218 = local_378[4];
        local_1e8 = &local_4a8;
        local_148 = (long)local_1ec * (long)local_1f0 * local_208;
        local_140 = &local_4a8;
        local_358 = &local_4a8;
        uStack_100 = 0;
        local_108 = 0;
        local_14c = 0x10;
        local_29c = local_3f0;
        local_29d = 1;
        local_4a8 = 0;
        local_498 = 0;
        local_490 = 0;
        local_480 = 0;
        local_47c = 0;
        local_478 = 0;
        local_474 = 0;
        local_470 = 0;
        local_468 = 0;
        local_4a0 = 0;
        local_460 = local_200;
        for (local_4ac = 0; local_4ac < local_38c; local_4ac = local_4ac + 1) {
          local_2c0 = &local_4f8;
          local_1b4 = *(int *)((long)local_368 + 0x2c);
          local_1b8 = (int)local_368[6];
          local_1bc = *(undefined4 *)((long)local_368 + 0x34);
          local_1c8 = *local_368 + local_368[8] * (long)local_4ac * local_368[2];
          local_1d0 = local_368[2];
          local_1d4 = (undefined4)local_368[3];
          local_1e0 = local_368[4];
          local_1b0 = &local_4f8;
          local_158 = (long)local_1b4 * (long)local_1b8 * local_1d0;
          local_3c = local_444 * in_stack_00000018;
          local_38 = &local_4f8;
          for (local_504 = 0; local_504 < local_39c; local_504 = local_504 + 1) {
            local_2a = (ushort)*(char *)(local_1c8 + (long)local_1b4 * (long)local_3c * local_1d0 +
                                         (long)(local_448 * in_stack_00000010) +
                                        (long)local_3d8[local_504]);
            auVar1 = vpinsrw_avx(ZEXT216(local_2a),(uint)local_2a,1);
            auVar1 = vpinsrw_avx(auVar1,(uint)local_2a,2);
            auVar1 = vpinsrw_avx(auVar1,(uint)local_2a,3);
            auVar1 = vpinsrw_avx(auVar1,(uint)local_2a,4);
            auVar1 = vpinsrw_avx(auVar1,(uint)local_2a,5);
            auVar1 = vpinsrw_avx(auVar1,(uint)local_2a,6);
            local_28._0_16_ = vpinsrw_avx(auVar1,(uint)local_2a,7);
            local_48 = local_460;
            local_f8 = *local_460;
            uStack_50 = 0;
            uStack_c0 = 0;
            local_e8 = 0;
            local_118._8_8_ = SUB168(ZEXT816(0),4);
            uStack_e0 = local_118._8_8_;
            uStack_f0 = 0;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_118._8_8_;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_f8;
            local_d8 = vpcmpgtb_avx(auVar3 << 0x40,auVar1);
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_f8;
            auVar1 = vpunpcklbw_avx(auVar2,local_d8);
            local_a8 = local_28._0_8_;
            paStack_a0 = (allocator_type *)local_28._8_8_;
            local_528 = auVar1._0_8_;
            local_b8 = local_528;
            uStack_520 = auVar1._8_8_;
            uStack_b0 = uStack_520;
            auVar2 = vpmullw_avx(local_28._0_16_,auVar1);
            local_88 = local_28._0_8_;
            paStack_80 = (allocator_type *)local_28._8_8_;
            local_98 = local_528;
            uStack_90 = uStack_520;
            auVar1 = vpmulhw_avx(local_28._0_16_,auVar1);
            local_538 = auVar2._0_8_;
            local_68 = local_538;
            uStack_530 = auVar2._8_8_;
            uStack_60 = uStack_530;
            local_548 = auVar1._0_8_;
            local_78 = local_548;
            uStack_540 = auVar1._8_8_;
            uStack_70 = uStack_540;
            auVar1 = vpunpcklwd_avx(auVar2,auVar1);
            local_228 = local_458._0_8_;
            uStack_220 = local_458._8_8_;
            local_558 = auVar1._0_8_;
            local_238 = local_558;
            uStack_550 = auVar1._8_8_;
            uStack_230 = uStack_550;
            local_458 = vpaddd_avx(local_458,auVar1);
            local_460 = (ulong *)((long)local_460 + 4);
            in_stack_fffffffffffffa20 = (allocator_type *)local_28._8_8_;
            local_118 = ZEXT816(0) << 0x20;
            local_c8 = local_f8;
            local_58 = local_f8;
            local_10 = local_2a;
            local_e = local_2a;
            local_c = local_2a;
            local_a = local_2a;
            local_8 = local_2a;
            local_6 = local_2a;
            local_4 = local_2a;
            local_2 = local_2a;
          }
          local_350 = &local_4f8;
          local_15c = 0x10;
          local_2cc = local_4ac;
          local_2cd = 1;
          local_4f8 = 0;
          local_4e8 = 0;
          local_4e0 = 0;
          local_4d0 = 0;
          local_4cc = 0;
          local_4c8 = 0;
          local_4c4 = 0;
          local_4c0 = 0;
          local_4b8 = 0;
          local_4f0 = 0;
          local_328 = local_350;
          local_4d8 = local_1e0;
        }
        local_128 = (undefined8 *)(local_3f8 + (long)(local_448 << 2) * 4);
        local_138 = local_458._0_8_;
        uStack_130 = local_458._8_8_;
        *local_128 = local_458._0_8_;
        local_128[1] = local_458._8_8_;
        local_318 = local_358;
        local_488 = local_218;
      }
      local_3f8 = local_3f8 + (long)(local_390 << 2) * 4;
    }
    local_308 = local_360;
    local_420 = local_1a8;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa20);
  return;
}

Assistant:

static void convolution_pack1to4_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_int8, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m128i _sum0 = _mm_setzero_si128();

                const signed char* kptr = weight_data_int8.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        __m128i _val = _mm_set1_epi16((short)sptr[space_ofs[k]]);

                        // TODO use _mm_cvtepi8_epi16 on sse4.1
                        __m128i _w = _mm_loadl_epi64((const __m128i*)kptr);
                        _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                        __m128i _sl = _mm_mullo_epi16(_val, _w);
                        __m128i _sh = _mm_mulhi_epi16(_val, _w);
                        __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);

                        _sum0 = _mm_add_epi32(_sum0, _s0);

                        kptr += 4;
                    }
                }

                _mm_storeu_si128((__m128i*)(outptr + j * 4), _sum0);
            }

            outptr += outw * 4;
        }
    }
}